

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O2

IntResult * __thiscall
slang::parsing::NumberParser::reportMissingDigits
          (IntResult *__return_storage_ptr__,NumberParser *this,Token sizeToken,Token baseToken,
          Token first)

{
  undefined8 uVar1;
  Info *pIVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  string_view sVar5;
  Token TVar6;
  Token baseToken_local;
  
  baseToken_local.info = baseToken.info;
  baseToken_local._0_8_ = baseToken._0_8_;
  uVar4 = sizeToken._0_8_;
  if ((first.info == (Info *)0x0) || (first.kind == EndOfFile)) {
    SVar3 = Token::location(&baseToken_local);
    sVar5 = Token::rawText(&baseToken_local);
    SVar3 = (SourceLocation)(sVar5._M_len * 0x10000000 + (long)SVar3);
  }
  else {
    SVar3 = Token::location(&first);
  }
  addDiag(this,(DiagCode)0x10003,SVar3);
  pIVar2 = baseToken_local.info;
  uVar1 = baseToken_local._0_8_;
  TVar6 = Token::createMissing(this->alloc,IntegerLiteral,SVar3);
  (__return_storage_ptr__->size).kind = (short)uVar4;
  (__return_storage_ptr__->size).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (__return_storage_ptr__->size).rawLen = (int)((ulong)uVar4 >> 0x20);
  (__return_storage_ptr__->size).info = sizeToken.info;
  baseToken_local.kind = (TokenKind)uVar1;
  baseToken_local._2_1_ = SUB81(uVar1,2);
  baseToken_local.numFlags.raw = SUB81(uVar1,3);
  baseToken_local.rawLen = SUB84(uVar1,4);
  (__return_storage_ptr__->base).kind = baseToken_local.kind;
  (__return_storage_ptr__->base).field_0x2 = baseToken_local._2_1_;
  (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)baseToken_local.numFlags.raw;
  (__return_storage_ptr__->base).rawLen = baseToken_local.rawLen;
  (__return_storage_ptr__->base).info = pIVar2;
  __return_storage_ptr__->value = TVar6;
  __return_storage_ptr__->isSimple = false;
  return __return_storage_ptr__;
}

Assistant:

NumberParser::IntResult NumberParser::reportMissingDigits(Token sizeToken, Token baseToken,
                                                          Token first) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    SourceLocation errLoc;
    if (first && first.kind != TokenKind::EndOfFile)
        errLoc = first.location();
    else
        errLoc = baseToken.location() + baseToken.rawText().size();

    addDiag(diag::ExpectedVectorDigits, errLoc);
    return IntResult::vector(sizeToken, baseToken,
                             Token::createMissing(alloc, TokenKind::IntegerLiteral, errLoc));
}